

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  roaring_array_t *prVar2;
  uint uVar3;
  container_t *pcVar4;
  roaring_bitmap_t *prVar5;
  uint end_index;
  ushort key;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  roaring_array_t *ra;
  ulong uVar12;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_75;
  uint8_t local_74;
  uint8_t local_73;
  uint16_t local_72;
  ulong local_70;
  roaring_array_t *local_68;
  ulong local_60;
  roaring_array_t *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_73 = '\0';
  uVar8 = (x1->high_low_container).size;
  prVar5 = x2;
  if (uVar8 != 0) {
    uVar3 = (x2->high_low_container).size;
    local_70 = (ulong)uVar3;
    prVar5 = x1;
    if (uVar3 != 0) {
      local_58 = &roaring_bitmap_create_with_capacity(uVar3 + uVar8)->high_low_container;
      if ((((x1->high_low_container).flags & 1) == 0) && (((x2->high_low_container).flags & 1) == 0)
         ) {
        local_58->flags = local_58->flags & 0xfe;
      }
      else {
        local_58->flags = local_58->flags | 1;
      }
      key = *(x1->high_low_container).keys;
      local_72 = *(x2->high_low_container).keys;
      local_50 = (ulong)-uVar8;
      local_60 = 0;
      uVar7 = 0;
      local_68 = &x2->high_low_container;
      local_48 = (ulong)uVar8;
LAB_00105fb1:
      do {
        iVar6 = (int)uVar7;
        uVar12 = uVar7 & 0xffffffff;
        iVar11 = (int)local_50 + iVar6;
        local_38 = (long)iVar6 * 8;
        lVar10 = 0;
        local_40 = uVar7;
        while( true ) {
          prVar2 = local_68;
          iVar9 = (int)lVar10;
          uVar8 = (uint)local_60;
          if (key == local_72) break;
          if (local_72 <= key) {
            local_75 = local_68->typecodes[local_60 & 0xffff];
            pcVar4 = get_copy_of_container
                               (local_68->containers[local_60 & 0xffff],&local_75,
                                (_Bool)(local_68->flags & 1));
            ra = local_58;
            if ((prVar2->flags & 1) != 0) {
              prVar2->containers[(int)uVar8] = pcVar4;
              prVar2->typecodes[(int)uVar8] = local_75;
            }
            ra_append(local_58,local_72,pcVar4,local_75);
            uVar8 = uVar8 + 1;
            if (uVar8 == (uint)local_70) {
              uVar3 = iVar9 + iVar6;
              goto LAB_0010620a;
            }
            local_72 = local_68->keys[(ulong)uVar8 & 0xffff];
            uVar7 = uVar12 + lVar10 & 0xffffffff;
            local_60 = (ulong)uVar8;
            goto LAB_00105fb1;
          }
          uVar7 = uVar12 + lVar10 & 0xffff;
          local_74 = (x1->high_low_container).typecodes[uVar7];
          pcVar4 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar7],&local_74,
                              (_Bool)((x1->high_low_container).flags & 1));
          if (((x1->high_low_container).flags & 1) != 0) {
            *(container_t **)((long)(x1->high_low_container).containers + lVar10 * 8 + local_38) =
                 pcVar4;
            (x1->high_low_container).typecodes[lVar10 + iVar6] = local_74;
          }
          ra_append(local_58,key,pcVar4,local_74);
          if (iVar11 + iVar9 != -1) {
            key = (x1->high_low_container).keys[(ushort)((short)uVar12 + (short)lVar10 + 1)];
          }
          lVar10 = lVar10 + 1;
          if ((int)lVar10 + iVar11 == 0) {
            uVar3 = (int)local_40 + (int)lVar10;
            uVar8 = (uint)local_60;
            ra = local_58;
            goto LAB_0010620a;
          }
        }
        uVar3 = iVar6 + iVar9 & 0xffff;
        local_74 = (x1->high_low_container).typecodes[uVar3];
        local_75 = local_68->typecodes[uVar8 & 0xffff];
        pcVar4 = container_or((x1->high_low_container).containers[uVar3],local_74,
                              local_68->containers[uVar8 & 0xffff],local_75,&local_73);
        ra_append(local_58,key,pcVar4,local_73);
        uVar7 = uVar12 + lVar10 + 1;
        uVar8 = uVar8 + 1;
        if (uVar8 == (uint)local_70 || iVar6 + iVar9 + (int)local_50 == -1) {
          uVar3 = iVar9 + iVar6 + 1;
          ra = local_58;
LAB_0010620a:
          end_index = (uint)local_48;
          if (uVar3 == end_index) {
            bVar1 = local_68->flags;
            x1 = (roaring_bitmap_t *)local_68;
            end_index = (uint)local_70;
            uVar3 = uVar8;
          }
          else {
            if (uVar8 != (uint)local_70) {
              return (roaring_bitmap_t *)ra;
            }
            bVar1 = (x1->high_low_container).flags;
          }
          ra_append_copy_range(ra,&x1->high_low_container,uVar3,end_index,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)ra;
        }
        key = (x1->high_low_container).keys[(uint)uVar7 & 0xffff];
        local_72 = local_68->keys[uVar8 & 0xffff];
        local_60 = (ulong)uVar8;
      } while( true );
    }
  }
  prVar5 = roaring_bitmap_copy(prVar5);
  return prVar5;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or(const roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_or(c1, type1, c2, type2, &result_type);

            // since we assume that the initial containers are non-empty, the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            // c1 = container_clone(c1, type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // c2 = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}